

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O1

pair<google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>::iterator,_google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>::iterator>
* __thiscall
google::protobuf::
Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>::
equal_range<google::protobuf::internal::(anonymous_namespace)::CustomStringView>
          (pair<google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>::iterator,_google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>::iterator>
           *__return_storage_ptr__,
          Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
          *this,key_arg<google::protobuf::internal::(anonymous_namespace)::CustomStringView> *key)

{
  NodeBase *pNVar1;
  uint uVar2;
  uint uVar3;
  NodeBase *pNVar4;
  ViewType k;
  NodeAndBucket NVar5;
  
  k._M_str = (key->str_)._M_dataplus._M_p;
  k._M_len = (key->str_)._M_string_length;
  NVar5 = protobuf::internal::
          KeyMapBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::FindHelper(&this->
                        super_KeyMapBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       ,k);
  pNVar1 = NVar5.node;
  uVar3 = NVar5.bucket;
  pNVar4 = pNVar1;
  uVar2 = uVar3;
  if ((pNVar1 != (NodeBase *)0x0) && (pNVar4 = pNVar1->next, pNVar4 == (NodeBase *)0x0)) {
    do {
      uVar2 = uVar2 + 1;
      if ((this->
          super_KeyMapBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ).super_UntypedMapBase.num_buckets_ <= uVar2) {
        pNVar4 = (NodeBase *)0x0;
        uVar2 = 0;
        break;
      }
      pNVar4 = (this->
               super_KeyMapBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ).super_UntypedMapBase.table_[uVar2];
    } while (pNVar4 == (NodeBase *)0x0);
  }
  (__return_storage_ptr__->first).super_UntypedMapIterator.node_ = pNVar1;
  (__return_storage_ptr__->first).super_UntypedMapIterator.m_ = (UntypedMapBase *)this;
  (__return_storage_ptr__->first).super_UntypedMapIterator.bucket_index_ = uVar3;
  (__return_storage_ptr__->second).super_UntypedMapIterator.node_ = pNVar4;
  (__return_storage_ptr__->second).super_UntypedMapIterator.m_ = (UntypedMapBase *)this;
  (__return_storage_ptr__->second).super_UntypedMapIterator.bucket_index_ = uVar2;
  return __return_storage_ptr__;
}

Assistant:

std::pair<iterator, iterator> equal_range(const key_arg<K>& key)
      ABSL_ATTRIBUTE_LIFETIME_BOUND {
    iterator it = find(key);
    if (it == end()) {
      return std::pair<iterator, iterator>(it, it);
    } else {
      iterator begin = it++;
      return std::pair<iterator, iterator>(begin, it);
    }
  }